

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

void draco::parser::SkipCharacters(DecoderBuffer *buffer,char *skip_chars)

{
  bool bVar1;
  size_t sVar2;
  char *in_RSI;
  DecoderBuffer *in_RDI;
  int i;
  bool skip;
  char c;
  int num_skip_chars;
  int local_1c;
  char local_15;
  int local_14;
  char *local_10;
  DecoderBuffer *local_8;
  
  if (in_RSI != (char *)0x0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    sVar2 = strlen(in_RSI);
    local_14 = (int)sVar2;
    while (bVar1 = DecoderBuffer::Peek<char>(local_8,&local_15), bVar1) {
      bVar1 = false;
      for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
        if (local_15 == local_10[local_1c]) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        return;
      }
      DecoderBuffer::Advance(local_8,1);
    }
  }
  return;
}

Assistant:

void SkipCharacters(DecoderBuffer *buffer, const char *skip_chars) {
  if (skip_chars == nullptr) {
    return;
  }
  const int num_skip_chars = static_cast<int>(strlen(skip_chars));
  char c;
  while (buffer->Peek(&c)) {
    // Check all characters in the pattern.
    bool skip = false;
    for (int i = 0; i < num_skip_chars; ++i) {
      if (c == skip_chars[i]) {
        skip = true;
        break;
      }
    }
    if (!skip) {
      return;
    }
    buffer->Advance(1);
  }
}